

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O0

int32 bio_readhdr(FILE *fp,char ***argname,char ***argval,int32 *swap)

{
  int iVar1;
  int32 iVar2;
  char **ppcVar3;
  char *pcVar4;
  uint local_5044;
  int local_5040;
  int32 lineno;
  int32 l;
  int32 i;
  char word [4096];
  char line [16384];
  int32 *swap_local;
  char ***argval_local;
  char ***argname_local;
  FILE *fp_local;
  
  ppcVar3 = (char **)__ckd_calloc__(0x21,8,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                                    ,0xc1);
  *argname = ppcVar3;
  ppcVar3 = (char **)__ckd_calloc__(0x20,8,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                                    ,0xc2);
  *argval = ppcVar3;
  pcVar4 = fgets(word + 0xff8,0x4000,(FILE *)fp);
  if (pcVar4 == (char *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
            ,0xc6,"Premature EOF, line %d\n",0);
  }
  else {
    local_5044 = 1;
    if (((word[0xff8] == 's') && (word[0xff9] == '3')) && (word[0xffa] == '\n')) {
      lineno = 0;
      while (pcVar4 = fgets(word + 0xff8,0x4000,(FILE *)fp), pcVar4 != (char *)0x0) {
        local_5044 = local_5044 + 1;
        iVar1 = __isoc99_sscanf(word + 0xff8,"%s%n",&l,&local_5040);
        if (iVar1 != 1) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                  ,0xd5,"Header format error, line %d\n",(ulong)local_5044);
          goto LAB_00113f3d;
        }
        iVar1 = strcmp((char *)&l,"endhdr");
        if (iVar1 == 0) goto LAB_00113ee9;
        if ((char)l != '#') {
          if (0x1f < lineno) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                    ,0xe0,"Max arg-value limit(%d) exceeded; increase BIO_HDRARG_MAX\n",0x20);
            goto LAB_00113f3d;
          }
          pcVar4 = __ckd_salloc__((char *)&l,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                                  ,0xe4);
          (*argname)[lineno] = pcVar4;
          iVar1 = __isoc99_sscanf(word + (long)local_5040 + 0xff8,"%s",&l);
          if (iVar1 != 1) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                    ,0xe6,"Header format error, line %d\n",(ulong)local_5044);
            goto LAB_00113f3d;
          }
          pcVar4 = __ckd_salloc__((char *)&l,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                                  ,0xe9);
          (*argval)[lineno] = pcVar4;
          lineno = lineno + 1;
        }
      }
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
              ,0xcf,"Premature EOF, line %d\n",(ulong)local_5044);
    }
    else {
      iVar1 = __isoc99_sscanf(word + 0xff8,"%s",&l);
      if (iVar1 == 1) {
        pcVar4 = __ckd_salloc__("version",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                                ,0xf4);
        **argname = pcVar4;
        pcVar4 = __ckd_salloc__((char *)&l,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                                ,0xf5);
        **argval = pcVar4;
        lineno = 1;
        bcomment_read(fp);
LAB_00113ee9:
        (*argname)[lineno] = (char *)0x0;
        iVar2 = swap_check(fp);
        *swap = iVar2;
        if (-1 < iVar2) {
          return 0;
        }
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                ,0xfd,"swap_check failed\n");
      }
      else {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                ,0xf0,"Header format error, line %d\n",1);
      }
    }
  }
LAB_00113f3d:
  bio_hdrarg_free(*argname,*argval);
  *argval = (char **)0x0;
  *argname = (char **)0x0;
  return -1;
}

Assistant:

int32
bio_readhdr(FILE * fp, char ***argname, char ***argval, int32 * swap)
{
    __BIGSTACKVARIABLE__ char line[16384], word[4096];
    int32 i, l;
    int32 lineno;

    *argname = (char **) ckd_calloc(BIO_HDRARG_MAX + 1, sizeof(char *));
    *argval = (char **) ckd_calloc(BIO_HDRARG_MAX, sizeof(char *));

    lineno = 0;
    if (fgets(line, sizeof(line), fp) == NULL){
        E_ERROR("Premature EOF, line %d\n", lineno);
        goto error_out;
    }
    lineno++;

    if ((line[0] == 's') && (line[1] == '3') && (line[2] == '\n')) {
        /* New format (post Dec-1996, including checksums); read argument-value pairs */
        for (i = 0;;) {
            if (fgets(line, sizeof(line), fp) == NULL) {
                E_ERROR("Premature EOF, line %d\n", lineno);
                goto error_out;
            }
            lineno++;

            if (sscanf(line, "%s%n", word, &l) != 1) {
                E_ERROR("Header format error, line %d\n", lineno);
                goto error_out;
            }
            if (strcmp(word, "endhdr") == 0)
                break;
            if (word[0] == '#') /* Skip comments */
                continue;

            if (i >= BIO_HDRARG_MAX) {
                E_ERROR
                    ("Max arg-value limit(%d) exceeded; increase BIO_HDRARG_MAX\n",
                     BIO_HDRARG_MAX);
                goto error_out;
            }

            (*argname)[i] = ckd_salloc(word);
            if (sscanf(line + l, "%s", word) != 1) {      /* Multi-word values not allowed */
                E_ERROR("Header format error, line %d\n", lineno);
                goto error_out;
            }
            (*argval)[i] = ckd_salloc(word);
            i++;
        }
    }
    else {
        /* Old format (without checksums); the first entry must be the version# */
        if (sscanf(line, "%s", word) != 1) {
            E_ERROR("Header format error, line %d\n", lineno);
            goto error_out;
        }

        (*argname)[0] = ckd_salloc("version");
        (*argval)[0] = ckd_salloc(word);
        i = 1;

        bcomment_read(fp);
    }
    (*argname)[i] = NULL;

    if ((*swap = swap_check(fp)) < 0) {
        E_ERROR("swap_check failed\n");
        goto error_out;
    }

    return 0;
error_out:
    bio_hdrarg_free(*argname, *argval);
    *argname = *argval = NULL;
    return -1;
}